

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_put(bsc_step_t depends,bsc_pid_t dst_pid,void *src,void *dst,bsc_size_t offset,bsc_size_t size)

{
  bsp_pid_t bVar1;
  request_t *prVar2;
  
  bVar1 = bsp_pid();
  prVar2 = new_request(depends);
  prVar2->kind = PUT;
  (prVar2->payload).put.src_addr = src;
  (prVar2->payload).put.dst_addr = dst;
  (prVar2->payload).put.src_pid = bVar1;
  (prVar2->payload).put.dst_pid = dst_pid;
  (prVar2->payload).put.size = size;
  (prVar2->payload).put.offset = offset;
  return depends + 1;
}

Assistant:

bsc_step_t bsc_put( bsc_step_t depends, bsc_pid_t dst_pid, 
        const void * src, void * dst, bsc_size_t offset, bsc_size_t size)
{
    request_t * req;
    comm_request_t r;
    r.src_addr = src;
    r.dst_addr = dst;
    r.src_pid = bsp_pid();
    r.dst_pid = dst_pid;
    r.size = size;
    r.offset = offset;
        
    req = new_request( depends );
    req->kind = PUT;
    req->payload.put = r;
    return depends + 1;
}